

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

int dump_schema_index(tnt_schema_sval *sval)

{
  undefined8 *puVar1;
  mh_assoc_t *pmVar2;
  uint uVar3;
  mh_int_t i;
  uint uVar4;
  uint uVar5;
  
  pmVar2 = sval->index;
  uVar3 = pmVar2->n_buckets;
  for (uVar4 = 0;
      (uVar5 = uVar3, uVar3 != uVar4 &&
      (uVar5 = uVar4, (pmVar2->b[uVar4 >> 4] >> (uVar4 & 0xf) & 1) == 0)); uVar4 = uVar4 + 1) {
  }
  do {
    do {
      if (uVar3 <= uVar5) {
        return 0;
      }
      puVar1 = (undefined8 *)pmVar2->p[uVar5]->data;
      printf("    %d: %s\n",(ulong)*(uint *)((long)puVar1 + 0xc),*puVar1);
      pmVar2 = sval->index;
      uVar3 = pmVar2->n_buckets;
      uVar4 = uVar5;
    } while (uVar3 <= uVar5);
    do {
      uVar4 = uVar4 + 1;
      uVar5 = uVar3;
      if (uVar3 <= uVar4) break;
      uVar5 = uVar4;
    } while ((pmVar2->b[uVar4 >> 4] >> (uVar4 & 0xf) & 1) == 0);
  } while( true );
}

Assistant:

int dump_schema_index(struct tnt_schema_sval *sval) {
	mh_int_t ipos = 0;
	mh_foreach(sval->index, ipos) {
		struct tnt_schema_ival *ival = NULL;
		ival = (*mh_assoc_node(sval->index, ipos))->data;
		printf("    %d: %s\n", ival->number, ival->name);
	}
	return 0;
}